

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O1

wchar_t sftp_cmd_cd(sftp_command *cmd)

{
  StripCtrlChars *pSVar1;
  char *pcVar2;
  sftp_request *psVar3;
  sftp_packet *psVar4;
  fxp_handle *handle;
  size_t sVar5;
  char *ptr;
  char *pcVar6;
  ptrlen str;
  ptrlen str_00;
  
  if (backend == (Backend *)0x0) {
    puts("psftp: not connected to a host; use \"open host.name\"");
  }
  else {
    if (cmd->nwords < 2) {
      pcVar2 = dupstr(homedir);
    }
    else {
      pcVar2 = canonify(cmd->words[1]);
    }
    psVar3 = fxp_opendir_send(pcVar2);
    psVar4 = sftp_wait_for_reply(psVar3);
    handle = fxp_opendir_recv(psVar4,psVar3);
    pSVar1 = string_scc;
    if (handle != (fxp_handle *)0x0) {
      psVar3 = fxp_close_send(handle);
      psVar4 = sftp_wait_for_reply(psVar3);
      fxp_close_recv(psVar4,psVar3);
      safefree(pwd);
      pSVar1 = string_scc;
      pwd = pcVar2;
      sVar5 = strlen(pcVar2);
      str.len = sVar5;
      str.ptr = pcVar2;
      pcVar2 = stripctrl_string_ptrlen(pSVar1,str);
      if (pcVar2 == (char *)0x0) {
        return L'\x01';
      }
      printf("Remote directory is now %s\n",pcVar2);
      safefree(pcVar2);
      return L'\x01';
    }
    sVar5 = strlen(pcVar2);
    str_00.len = sVar5;
    str_00.ptr = pcVar2;
    ptr = stripctrl_string_ptrlen(pSVar1,str_00);
    if (ptr != (char *)0x0) {
      pcVar6 = fxp_error();
      printf("Directory %s: %s\n",ptr,pcVar6);
      safefree(ptr);
    }
    safefree(pcVar2);
  }
  return L'\0';
}

Assistant:

int sftp_cmd_cd(struct sftp_command *cmd)
{
    struct fxp_handle *dirh;
    struct sftp_packet *pktin;
    struct sftp_request *req;
    char *dir;

    if (!backend) {
        not_connected();
        return 0;
    }

    if (cmd->nwords < 2)
        dir = dupstr(homedir);
    else {
        dir = canonify(cmd->words[1]);
    }

    req = fxp_opendir_send(dir);
    pktin = sftp_wait_for_reply(req);
    dirh = fxp_opendir_recv(pktin, req);

    if (!dirh) {
        with_stripctrl(san, dir)
            printf("Directory %s: %s\n", san, fxp_error());
        sfree(dir);
        return 0;
    }

    req = fxp_close_send(dirh);
    pktin = sftp_wait_for_reply(req);
    fxp_close_recv(pktin, req);

    sfree(pwd);
    pwd = dir;
    with_stripctrl(san, pwd)
        printf("Remote directory is now %s\n", san);

    return 1;
}